

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O1

string_view slang::DiagnosticClient::getSeverityString(DiagnosticSeverity severity)

{
  string_view sVar1;
  
  sVar1._M_str = &DAT_004f50f0 + *(int *)(&DAT_004f50f0 + (long)(int)severity * 4);
  sVar1._M_len = *(size_t *)(&DAT_004f5108 + (long)(int)severity * 8);
  return sVar1;
}

Assistant:

std::string_view DiagnosticClient::getSeverityString(DiagnosticSeverity severity) {
    switch (severity) {
        case DiagnosticSeverity::Ignored:
            return "ignored";
        case DiagnosticSeverity::Note:
            return "note";
        case DiagnosticSeverity::Warning:
            return "warning";
        case DiagnosticSeverity::Error:
            return "error";
        case DiagnosticSeverity::Fatal:
            return "fatal error";
    }
    SLANG_UNREACHABLE;
}